

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curleasy.cpp
# Opt level: O0

Easy * __thiscall curl::Easy::operator=(Easy *this,Easy *other)

{
  CURL *pCVar1;
  runtime_error *this_00;
  CURL *tmp_handle;
  Easy *other_local;
  Easy *this_local;
  
  pCVar1 = (CURL *)curl_easy_duphandle(other->handle);
  if (pCVar1 == (CURL *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"curl::Easy copy assignment: curl_easy_duphandle failed");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  curl_easy_cleanup(this->handle);
  this->handle = pCVar1;
  return this;
}

Assistant:

Easy& Easy::operator=(const Easy& other) {
    CURL* tmp_handle = curl_easy_duphandle(other.handle);
    if(tmp_handle == nullptr) {
        throw std::runtime_error(
            "curl::Easy copy assignment: curl_easy_duphandle failed");
    }
    // dup succeeded, now destroy any handle we might have and copy the tmp
    curl_easy_cleanup(handle);
    handle = tmp_handle;
    return *this;
}